

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O3

void mllr_dump(float32 ***A,float32 **B,float32 **H,int32 veclen,int32 nclass)

{
  char *__s;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (A == (float32 ***)0x0) {
    __assert_fail("A != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                  ,0x52,"void mllr_dump(float32 ***, float32 **, float32 **, int32, int32)");
  }
  if (B == (float32 **)0x0) {
    __assert_fail("B != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                  ,0x53,"void mllr_dump(float32 ***, float32 **, float32 **, int32, int32)");
  }
  uVar1 = (ulong)(uint)veclen;
  __s = (char *)__ckd_calloc__((long)((veclen + 2) * veclen * 0x14),1,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                               ,0x55);
  if (0 < nclass) {
    uVar3 = 0;
    do {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
              ,0x58,"%d:\n",uVar3 & 0xffffffff);
      if (veclen < 1) {
        __s[2] = '\0';
        __s[0] = 'B';
        __s[1] = '\n';
LAB_00116755:
        sprintf(__s,"%s \n",__s);
        __s[0] = 'H';
        __s[1] = '\n';
        __s[2] = '\0';
      }
      else {
        uVar2 = 0;
        do {
          sprintf(__s,"A %d ",uVar2 & 0xffffffff);
          uVar4 = 0;
          do {
            sprintf(__s,"%s %f ",(double)(float)A[uVar3][uVar2][uVar4],__s);
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
          sprintf(__s,"%s\n",__s);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                  ,0x5f,"%s\n",__s);
          uVar2 = uVar2 + 1;
        } while (uVar2 != uVar1);
        __s[2] = '\0';
        __s[0] = 'B';
        __s[1] = '\n';
        if (veclen < 1) goto LAB_00116755;
        uVar2 = 0;
        do {
          sprintf(__s,"%s %f ",(double)(float)B[uVar3][uVar2],__s);
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
        sprintf(__s,"%s \n",__s);
        __s[0] = 'H';
        __s[1] = '\n';
        __s[2] = '\0';
        if (0 < veclen) {
          uVar2 = 0;
          do {
            sprintf(__s,"%s %f ",(double)(float)H[uVar3][uVar2],__s);
            uVar2 = uVar2 + 1;
          } while (uVar1 != uVar2);
        }
      }
      sprintf(__s,"%s \n",__s);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
              ,0x6e,"%s\n",__s);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nclass);
  }
  ckd_free(__s);
  return;
}

Assistant:

void
mllr_dump(float32 *** A, float32 ** B, float32 **H, 
	  int32 veclen, int32 nclass)
{
    int32 i, j, k;
    char *tmpstr;
    assert(A != NULL);
    assert(B != NULL);

    tmpstr = ckd_calloc((veclen * (veclen + 2) * 20), sizeof(char));

    for (i = 0; i < nclass; i++) {
        E_INFO("%d:\n", i);
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "A %d ", j);
            for (k = 0; k < veclen; k++) {
                sprintf(tmpstr, "%s %f ", tmpstr, A[i][j][k]);
            }
            sprintf(tmpstr, "%s\n", tmpstr);
            E_INFO("%s\n", tmpstr);
        }

        sprintf(tmpstr, "B\n");
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "%s %f ", tmpstr, B[i][j]);
        }
        sprintf(tmpstr, "%s \n", tmpstr);

        sprintf(tmpstr, "H\n");
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "%s %f ", tmpstr, H[i][j]);
        }
        sprintf(tmpstr, "%s \n", tmpstr);

        E_INFO("%s\n", tmpstr);
    }

    ckd_free(tmpstr);
}